

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_lookup_cache.hpp
# Opt level: O2

void __thiscall
duckdb::DateLookupCache<duckdb::DatePart::MonthOperator>::BuildCache
          (DateLookupCache<duckdb::DatePart::MonthOperator> *this)

{
  pointer __p;
  pointer __p_00;
  long lVar1;
  int32_t d;
  long lVar2;
  __uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_> local_18;
  
  __p_00 = (pointer)operator_new__(0xe720);
  local_18._M_t.super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
  super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl =
       (tuple<unsigned_short_*,_std::default_delete<unsigned_short[]>_>)
       (_Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>)0x0;
  ::std::__uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>::reset
            ((__uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_> *)this,__p_00)
  ;
  ::std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::~unique_ptr
            ((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)&local_18);
  for (lVar2 = 0; lVar2 != 0x7390; lVar2 = lVar2 + 1) {
    lVar1 = DatePart::MonthOperator::Operation<duckdb::date_t,long>((date_t)(int32_t)lVar2);
    *(short *)((long)(this->cache).
                     super_unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>._M_t
                     .super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>
                     .super__Head_base<0UL,_unsigned_short_*,_false> + lVar2 * 2) = (short)lVar1;
  }
  return;
}

Assistant:

void BuildCache() {
		D_ASSERT(CACHE_MAX_DATE > CACHE_MIN_DATE);
		cache = make_unsafe_uniq_array_uninitialized<CACHE_TYPE>(CACHE_MAX_DATE - CACHE_MIN_DATE);
		for (int32_t d = CACHE_MIN_DATE; d < CACHE_MAX_DATE; d++) {
			date_t date(d);
			auto cache_entry = OP::template Operation<date_t, int64_t>(date);
			cache[GetDateCacheEntry(date)] = UnsafeNumericCast<CACHE_TYPE>(cache_entry);
		}
	}